

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void int32_suite::test_minus_two(void)

{
  value *pvVar1;
  value_type input [5];
  decoder decoder;
  value local_68 [2];
  uchar local_60 [8];
  decoder local_58;
  
  local_58.input._M_str = local_60;
  local_60[4] = 0xff;
  local_60[0] = 0xc4;
  local_60[1] = 0xfe;
  local_60[2] = 0xff;
  local_60[3] = 0xff;
  local_58.input._M_len = 5;
  local_58.current.view._M_len = 0;
  local_58.current.view._M_str = (uchar *)0x0;
  local_58.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_68[0] = local_58.current.code;
  pvVar1 = local_68 + 1;
  local_68[1] = 0xc4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::int32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x18b,"void int32_suite::test_minus_two()",local_68,pvVar1);
  local_68[0] = trial::protocol::bintoken::detail::decoder::
                overloader<trial::protocol::bintoken::token::int32>::decode(&local_58);
  local_68[1] = 0xfffffffe;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("decoder.value<token::int32>()","-2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x18c,"void int32_suite::test_minus_two()",local_68,pvVar1);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_68[0] = local_58.current.code;
  local_68[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x18e,"void int32_suite::test_minus_two()",local_68,pvVar1);
  return;
}

Assistant:

void test_minus_two()
{
    const value_type input[] = { token::code::int32, 0xFE, 0xFF, 0xFF, 0xFF };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::int32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::int32>(), -2);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}